

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_typed_buffer_header_with_size(void *buf,size_t *bufsiz,flatbuffers_thash_t thash)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 5;
  if (((ulong)buf & 3) == 0) {
    uVar1 = *bufsiz;
    iVar2 = 6 - (uint)(uVar1 >> 3 < 0x1fffffff);
    if (uVar1 >> 3 < 0x1fffffff) {
      iVar2 = 1;
      if (0xb < uVar1) {
        iVar2 = 0x24;
        if ((ulong)*buf <= uVar1 - 4) {
          if ((thash != 0) && (*(flatbuffers_thash_t *)((long)buf + 4) != thash)) {
            return 2;
          }
          *bufsiz = (ulong)*buf + 4;
          return 0;
        }
      }
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int flatcc_verify_typed_buffer_header_with_size(const void *buf, size_t *bufsiz, flatbuffers_thash_t thash)
{
    thash_t id, id2;
    size_t size_field;

    verify_runtime(!(((size_t)buf) & (offset_size - 1)), flatcc_verify_error_runtime_buffer_header_not_aligned);
    /* -8 ensures no scalar or offset field size can overflow. */
    verify_runtime(*bufsiz <= FLATBUFFERS_UOFFSET_MAX - 8, flatcc_verify_error_runtime_buffer_size_too_large);

    /* Size field, offset field, optional identifier field that must be read even if not present. */
    verify(*bufsiz >= 2 * offset_size + FLATBUFFERS_IDENTIFIER_SIZE, flatcc_verify_error_buffer_header_too_small);

    size_field = (size_t)read_uoffset(buf, 0);
    verify_runtime(size_field <= *bufsiz - offset_size, flatcc_verify_error_runtime_buffer_size_less_than_size_field);
    if (thash != 0) {
        id2 = thash;
        id = read_thash(buf, offset_size);
        verify(id2 == 0 || id == id2, flatcc_verify_error_identifier_mismatch);
    }
    *bufsiz = size_field + offset_size;
    return flatcc_verify_ok;
}